

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscCore.c
# Opt level: O2

void Ssc_ManPrintStats(Ssc_Man_t *p)

{
  Ssc_Pars_t *pSVar1;
  uint uVar2;
  uint uVar3;
  double dVar4;
  double dVar5;
  
  pSVar1 = p->pPars;
  Abc_Print(1,
            "Parameters: SimWords = %d. SatConfs = %d. SatVarMax = %d. CallsRec = %d. Verbose = %d.\n"
            ,(ulong)(uint)pSVar1->nWords,(ulong)(uint)pSVar1->nBTLimit,
            (ulong)(uint)pSVar1->nSatVarMax,(ulong)(uint)pSVar1->nCallsRecycle,pSVar1->fVerbose);
  Abc_Print(1,"SAT calls : Total = %d. Proof = %d. Cex = %d. Undec = %d.\n",
            (ulong)(uint)p->nSatCalls,(ulong)(uint)p->nSatCallsUnsat,(ulong)(uint)p->nSatCallsSat,
            (ulong)(uint)p->nSatCallsUndec);
  uVar2 = sat_solver_nvars(p->pSat);
  uVar3 = sat_solver_nclauses(p->pSat);
  Abc_Print(1,"SAT solver: Vars = %d. Clauses = %d. Recycles = %d. Sim rounds = %d.\n",(ulong)uVar2,
            (ulong)uVar3,(ulong)(uint)p->nRecycles,(ulong)(uint)p->nSimRounds);
  p->timeOther = p->timeTotal -
                 (p->timeSatUnsat + p->timeCnfGen + p->timeSatSat + p->timeSimSat + p->timeSimInit +
                 p->timeSatUndec);
  Abc_Print(1,"%s =","Initialization ");
  dVar4 = 0.0;
  if (p->timeTotal != 0) {
    dVar4 = ((double)p->timeSimInit * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",(double)p->timeSimInit / 1000000.0,dVar4);
  Abc_Print(1,"%s =","SAT simulation ");
  dVar4 = 0.0;
  if (p->timeTotal != 0) {
    dVar4 = ((double)p->timeSimSat * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",(double)p->timeSimSat / 1000000.0,dVar4);
  Abc_Print(1,"%s =","CNF generation ");
  dVar4 = 0.0;
  if (p->timeTotal != 0) {
    dVar4 = ((double)p->timeSimSat * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",(double)p->timeSimSat / 1000000.0,dVar4);
  Abc_Print(1,"%s =","SAT solving    ");
  dVar5 = (double)(p->timeSat - p->timeCnfGen);
  dVar4 = 0.0;
  if (p->timeTotal != 0) {
    dVar4 = (dVar5 * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",dVar5 / 1000000.0,dVar4);
  Abc_Print(1,"%s =","  unsat        ");
  dVar4 = 0.0;
  if (p->timeTotal != 0) {
    dVar4 = ((double)p->timeSatUnsat * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",(double)p->timeSatUnsat / 1000000.0,dVar4);
  Abc_Print(1,"%s =","  sat          ");
  dVar4 = 0.0;
  if (p->timeTotal != 0) {
    dVar4 = ((double)p->timeSatSat * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",(double)p->timeSatSat / 1000000.0,dVar4);
  Abc_Print(1,"%s =","  undecided    ");
  dVar4 = 0.0;
  if (p->timeTotal != 0) {
    dVar4 = ((double)p->timeSatUndec * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",(double)p->timeSatUndec / 1000000.0,dVar4);
  Abc_Print(1,"%s =","Other          ");
  dVar4 = 0.0;
  if (p->timeTotal != 0) {
    dVar4 = ((double)p->timeOther * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",(double)p->timeOther / 1000000.0,dVar4);
  Abc_Print(1,"%s =","TOTAL          ");
  dVar4 = (double)p->timeTotal;
  dVar5 = 0.0;
  if (p->timeTotal != 0) {
    dVar5 = (dVar4 * 100.0) / dVar4;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",dVar4 / 1000000.0,dVar5);
  return;
}

Assistant:

void Ssc_ManPrintStats( Ssc_Man_t * p )
{
    Abc_Print( 1, "Parameters: SimWords = %d. SatConfs = %d. SatVarMax = %d. CallsRec = %d. Verbose = %d.\n",
        p->pPars->nWords, p->pPars->nBTLimit, p->pPars->nSatVarMax, p->pPars->nCallsRecycle, p->pPars->fVerbose );
    Abc_Print( 1, "SAT calls : Total = %d. Proof = %d. Cex = %d. Undec = %d.\n",
        p->nSatCalls, p->nSatCallsUnsat, p->nSatCallsSat, p->nSatCallsUndec );
    Abc_Print( 1, "SAT solver: Vars = %d. Clauses = %d. Recycles = %d. Sim rounds = %d.\n",
        sat_solver_nvars(p->pSat), sat_solver_nclauses(p->pSat), p->nRecycles, p->nSimRounds );

    p->timeOther = p->timeTotal - p->timeSimInit - p->timeSimSat - p->timeCnfGen - p->timeSatSat - p->timeSatUnsat - p->timeSatUndec;
    ABC_PRTP( "Initialization ", p->timeSimInit,            p->timeTotal );
    ABC_PRTP( "SAT simulation ", p->timeSimSat,             p->timeTotal );
    ABC_PRTP( "CNF generation ", p->timeSimSat,             p->timeTotal );
    ABC_PRTP( "SAT solving    ", p->timeSat-p->timeCnfGen,  p->timeTotal );
    ABC_PRTP( "  unsat        ", p->timeSatUnsat,           p->timeTotal );
    ABC_PRTP( "  sat          ", p->timeSatSat,             p->timeTotal );
    ABC_PRTP( "  undecided    ", p->timeSatUndec,           p->timeTotal );
    ABC_PRTP( "Other          ", p->timeOther,              p->timeTotal );
    ABC_PRTP( "TOTAL          ", p->timeTotal,              p->timeTotal );
}